

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::anon_unknown_0::CommandLineInterfaceTest_InsertWithAnnotationFixup_Test
::~CommandLineInterfaceTest_InsertWithAnnotationFixup_Test
          (CommandLineInterfaceTest_InsertWithAnnotationFixup_Test *this)

{
  CommandLineInterfaceTester::~CommandLineInterfaceTester((CommandLineInterfaceTester *)this);
  operator_delete(this,0x2e8);
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, InsertWithAnnotationFixup) {
  // Check that annotation spans are updated after insertions.

  CreateTempFile("foo.proto",
                 "syntax = \"proto2\";\n"
                 "message MockCodeGenerator_Annotate {}\n");

  Run("protocol_compiler "
      "--test_out=TestParameter:$tmpdir "
      "--plug_out=TestPluginParameter:$tmpdir "
      "--test_out=insert_endlines=test_generator,test_plugin:$tmpdir "
      "--plug_out=insert_endlines=test_generator,test_plugin:$tmpdir "
      "--proto_path=$tmpdir foo.proto");

  ExpectNoErrors();
  CheckGeneratedAnnotations("test_generator", "foo.proto");
  CheckGeneratedAnnotations("test_plugin", "foo.proto");
}